

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

void __thiscall
CPP::WriteInitialization::writePixmapFunctionIcon
          (WriteInitialization *this,QTextStream *output,QString *iconName,QString *indent,
          DomResourceIcon *i)

{
  long lVar1;
  bool bVar2;
  QString *in_RCX;
  QTextStream *in_RDX;
  WriteInitialization *in_RSI;
  DomResourceIcon *in_R8;
  long in_FS_OFFSET;
  QLatin1StringView t;
  DomResourcePixmap *in_stack_fffffffffffffd08;
  char *in_stack_fffffffffffffd10;
  QString *in_stack_fffffffffffffd18;
  WriteInitialization *in_stack_fffffffffffffd20;
  QString *in_stack_fffffffffffffd28;
  QTextStream *in_stack_fffffffffffffd30;
  WriteInitialization *in_stack_fffffffffffffd38;
  QLatin1StringView in_stack_fffffffffffffdd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = DomResourceIcon::hasElementNormalOff(in_R8);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd18,(size_t)in_stack_fffffffffffffd10);
    DomResourceIcon::elementNormalOff(in_R8);
    DomResourcePixmap::text(in_stack_fffffffffffffd08);
    pixCall(in_stack_fffffffffffffd38,in_stack_fffffffffffffdd0,(QString *)in_stack_fffffffffffffd30
           );
    writeIconAddPixmap(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                       (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                       in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    QString::~QString((QString *)0x13c4e5);
    QString::~QString((QString *)0x13c4f2);
  }
  bVar2 = DomResourceIcon::hasElementNormalOn(in_R8);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd18,(size_t)in_stack_fffffffffffffd10);
    DomResourceIcon::elementNormalOn(in_R8);
    DomResourcePixmap::text(in_stack_fffffffffffffd08);
    pixCall(in_stack_fffffffffffffd38,in_stack_fffffffffffffdd0,(QString *)in_stack_fffffffffffffd30
           );
    writeIconAddPixmap(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                       (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                       in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    QString::~QString((QString *)0x13c5e3);
    QString::~QString((QString *)0x13c5f0);
  }
  bVar2 = DomResourceIcon::hasElementDisabledOff(in_R8);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd18,(size_t)in_stack_fffffffffffffd10);
    DomResourceIcon::elementDisabledOff(in_R8);
    DomResourcePixmap::text(in_stack_fffffffffffffd08);
    pixCall(in_stack_fffffffffffffd38,in_stack_fffffffffffffdd0,(QString *)in_stack_fffffffffffffd30
           );
    writeIconAddPixmap(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                       (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                       in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    QString::~QString((QString *)0x13c6db);
    QString::~QString((QString *)0x13c6e8);
  }
  bVar2 = DomResourceIcon::hasElementDisabledOn(in_R8);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd18,(size_t)in_stack_fffffffffffffd10);
    DomResourceIcon::elementDisabledOn(in_R8);
    DomResourcePixmap::text(in_stack_fffffffffffffd08);
    pixCall(in_stack_fffffffffffffd38,in_stack_fffffffffffffdd0,(QString *)in_stack_fffffffffffffd30
           );
    writeIconAddPixmap(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                       (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                       in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    QString::~QString((QString *)0x13c7c7);
    QString::~QString((QString *)0x13c7d4);
  }
  bVar2 = DomResourceIcon::hasElementActiveOff(in_R8);
  if (bVar2) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd18,(size_t)in_stack_fffffffffffffd10);
    DomResourceIcon::elementActiveOff(in_R8);
    DomResourcePixmap::text(in_stack_fffffffffffffd08);
    pixCall(in_stack_fffffffffffffd38,in_stack_fffffffffffffdd0,(QString *)in_stack_fffffffffffffd30
           );
    writeIconAddPixmap(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                       (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                       in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    QString::~QString((QString *)0x13c8b3);
    QString::~QString((QString *)0x13c8c0);
  }
  bVar2 = DomResourceIcon::hasElementActiveOn(in_R8);
  if (bVar2) {
    in_stack_fffffffffffffd38 = in_RSI;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd18,(size_t)in_stack_fffffffffffffd10);
    DomResourceIcon::elementActiveOn(in_R8);
    DomResourcePixmap::text(in_stack_fffffffffffffd08);
    pixCall(in_stack_fffffffffffffd38,in_stack_fffffffffffffdd0,(QString *)in_stack_fffffffffffffd30
           );
    writeIconAddPixmap(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                       (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                       in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    QString::~QString((QString *)0x13c99f);
    QString::~QString((QString *)0x13c9ac);
  }
  bVar2 = DomResourceIcon::hasElementSelectedOff(in_R8);
  if (bVar2) {
    in_stack_fffffffffffffd20 = in_RSI;
    in_stack_fffffffffffffd28 = in_RCX;
    in_stack_fffffffffffffd30 = in_RDX;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffd18,(size_t)in_stack_fffffffffffffd10);
    DomResourceIcon::elementSelectedOff(in_R8);
    DomResourcePixmap::text(in_stack_fffffffffffffd08);
    pixCall(in_stack_fffffffffffffd38,in_stack_fffffffffffffdd0,(QString *)in_stack_fffffffffffffd30
           );
    writeIconAddPixmap(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                       (QString *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                       in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    QString::~QString((QString *)0x13ca8b);
    QString::~QString((QString *)0x13ca98);
  }
  bVar2 = DomResourceIcon::hasElementSelectedOn(in_R8);
  if (bVar2) {
    t = Qt::Literals::StringLiterals::operator____L1((char *)in_RDX,(size_t)in_RCX);
    DomResourceIcon::elementSelectedOn(in_R8);
    DomResourcePixmap::text((DomResourcePixmap *)in_RSI);
    pixCall(in_stack_fffffffffffffd38,t,(QString *)in_stack_fffffffffffffd30);
    writeIconAddPixmap(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                       (QString *)in_stack_fffffffffffffd20,(QString *)in_RDX,(char *)in_RCX,
                       (char *)in_RSI);
    QString::~QString((QString *)0x13cb75);
    QString::~QString((QString *)0x13cb82);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void WriteInitialization::writePixmapFunctionIcon(QTextStream &output,
                                                  const QString &iconName,
                                                  const QString &indent,
                                                  const DomResourceIcon *i) const
{
    if (i->hasElementNormalOff()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementNormalOff()->text()),
                           "Normal", "Off");
    }
    if (i->hasElementNormalOn()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementNormalOn()->text()),
                           "Normal", "On");
    }
    if (i->hasElementDisabledOff()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementDisabledOff()->text()),
                           "Disabled", "Off");
    }
    if (i->hasElementDisabledOn()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementDisabledOn()->text()),
                           "Disabled", "On");
    }
    if (i->hasElementActiveOff()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementActiveOff()->text()),
                           "Active", "Off");
    }
    if (i->hasElementActiveOn()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementActiveOn()->text()),
                           "Active", "On");
    }
    if (i->hasElementSelectedOff()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementSelectedOff()->text()),
                           "Selected", "Off");
    }
    if (i->hasElementSelectedOn()) {
        writeIconAddPixmap(output, indent,  iconName,
                           pixCall("QPixmap"_L1, i->elementSelectedOn()->text()),
                           "Selected", "On");
    }
}